

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86_avx::forward_int8_x86
          (Convolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  float *pfVar5;
  Convolution *in_RCX;
  vector<float,_std::allocator<float>_> *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  float scale_in_6;
  int p_6;
  Mat scale_in_data_4;
  float scale_in_5;
  int p_5;
  vector<float,_std::allocator<float>_> dequantize_scales;
  float scale_out;
  float scale_in_4;
  int p_4;
  vector<float,_std::allocator<float>_> requantize_scales;
  float scale_in_3;
  int p_3;
  Mat scale_in_data_3;
  float scale_in_2;
  int p_2;
  Mat scale_in_data_2;
  float scale_in_1;
  int p_1;
  Mat scale_in_data_1;
  float scale_in;
  int p;
  Mat scale_in_data;
  Mat top_blob_int32;
  int in_stack_00000418;
  int num_input;
  size_t out_elemsize;
  undefined4 in_stack_00000428;
  bool use_int8_requantize;
  int in_stack_0000042c;
  int out_elempack;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  int channels;
  int h;
  int w;
  Mat bottom_blob_bordered;
  Option opt_q;
  Mat bottom_blob_int8;
  int elembits;
  Option *in_stack_00000928;
  Mat *in_stack_00000930;
  Mat *in_stack_00000938;
  Mat *in_stack_00000940;
  Mat *in_stack_fffffffffffffa98;
  undefined4 uVar7;
  Allocator *pAVar6;
  Convolution *in_stack_fffffffffffffaa0;
  undefined4 uVar8;
  size_t _elemsize;
  Mat *in_stack_fffffffffffffaa8;
  undefined4 uVar9;
  int _w;
  Convolution *in_stack_fffffffffffffab0;
  Convolution *pCVar10;
  int in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  Mat *in_stack_fffffffffffffac0;
  Allocator *in_stack_fffffffffffffad0;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffae8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffaf0;
  Option *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  Mat *in_stack_fffffffffffffb18;
  Mat *in_stack_fffffffffffffb20;
  Option *in_stack_fffffffffffffb98;
  Mat *in_stack_fffffffffffffba0;
  Mat *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  undefined8 in_stack_fffffffffffffbd0;
  Option *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffbe4;
  Mat *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  float in_stack_fffffffffffffbf4;
  Mat *in_stack_fffffffffffffbf8;
  Mat *in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc10;
  Option *in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc20;
  Option *in_stack_fffffffffffffc28;
  Mat *in_stack_fffffffffffffc30;
  Mat *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  undefined4 in_stack_fffffffffffffc54;
  undefined4 uVar15;
  float in_stack_fffffffffffffc60;
  float fVar16;
  undefined4 in_stack_fffffffffffffc64;
  Option *in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffcac;
  int in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  int in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  Mat *in_stack_fffffffffffffcd0;
  Mat *in_stack_fffffffffffffcd8;
  int local_2f4;
  float local_2d8;
  int local_2d4;
  Mat local_2d0;
  float local_288;
  int local_284;
  Mat local_280;
  float local_238;
  int in_stack_fffffffffffffdcc;
  int iVar17;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  Mat *in_stack_fffffffffffffdd8;
  Mat *in_stack_fffffffffffffde0;
  Mat *in_stack_fffffffffffffde8;
  float local_1e8;
  int local_1e4;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  Option *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  Option *in_stack_fffffffffffffe88;
  int local_138;
  Mat local_110;
  _func_int **local_b8;
  size_t sStack_b0;
  size_t sStack_a8;
  undefined8 uStack_a0;
  Allocator *local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  size_type sStack_80;
  int local_2c;
  Convolution *local_28;
  vector<float,_std::allocator<float>_> *local_20;
  int local_4;
  
  iVar17 = (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_2c = ncnn::Mat::elembits(in_RSI);
  ncnn::Mat::Mat((Mat *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  if (local_2c != 8) {
    local_b8 = (local_28->super_Layer)._vptr_Layer;
    sStack_a8._0_1_ = (local_28->super_Layer).support_tensor_storage;
    sStack_a8._1_1_ = (local_28->super_Layer).support_weight_fp16_storage;
    sStack_a8._2_1_ = (local_28->super_Layer).support_reserved_0;
    sStack_a8._3_1_ = (local_28->super_Layer).support_reserved_1;
    sStack_a8._4_1_ = (local_28->super_Layer).support_reserved_2;
    sStack_a8._5_1_ = (local_28->super_Layer).support_reserved_3;
    sStack_a8._6_1_ = (local_28->super_Layer).support_reserved_4;
    sStack_a8._7_1_ = (local_28->super_Layer).support_reserved_5;
    uStack_a0._0_1_ = (local_28->super_Layer).support_reserved_6;
    uStack_a0._1_1_ = (local_28->super_Layer).support_reserved_7;
    uStack_a0._2_1_ = (local_28->super_Layer).support_reserved_8;
    uStack_a0._3_1_ = (local_28->super_Layer).support_reserved_9;
    uStack_a0._4_1_ = (local_28->super_Layer).support_reserved_10;
    uStack_a0._5_1_ = (local_28->super_Layer).support_reserved_11;
    uStack_a0._6_1_ = (local_28->super_Layer).support_reserved_12;
    uStack_a0._7_1_ = (local_28->super_Layer).support_reserved_13;
    local_98 = (Allocator *)(local_28->super_Layer).userdata;
    uStack_90 = *(undefined8 *)&(local_28->super_Layer).typeindex;
    uStack_88 = *(undefined8 *)&(local_28->super_Layer).type;
    sStack_80 = (local_28->super_Layer).type._M_string_length;
    sStack_b0._0_1_ = (local_28->super_Layer).support_tensor_storage;
    sStack_b0._1_1_ = (local_28->super_Layer).support_weight_fp16_storage;
    sStack_b0._2_1_ = (local_28->super_Layer).support_reserved_0;
    sStack_b0._3_1_ = (local_28->super_Layer).support_reserved_1;
    sStack_b0._4_1_ = (local_28->super_Layer).support_reserved_2;
    sStack_b0._5_1_ = (local_28->super_Layer).support_reserved_3;
    sStack_b0._6_1_ = (local_28->super_Layer).support_reserved_4;
    sStack_b0._7_1_ = (local_28->super_Layer).support_reserved_5;
    quantize_to_int8((Mat *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                     in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  }
  ncnn::Mat::Mat(&local_110);
  Convolution::make_padding
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,(Mat *)in_stack_fffffffffffffaa0,
             (Option *)in_stack_fffffffffffffa98);
  bVar2 = ncnn::Mat::empty((Mat *)in_stack_fffffffffffffaa0);
  uVar15 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc54);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    iVar4 = (local_110.h -
            (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) + -1) + 1)) /
            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) + 1;
    local_138 = 1;
    if ((((ulong)(local_28->super_Layer).userdata & 0x100000000000000) != 0) &&
       (local_138 = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0)) {
      local_138 = 4;
    }
    bVar2 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) < 0x65;
    iVar14 = local_138;
    if (bVar2) {
      iVar14 = local_138 << 2;
    }
    iVar13 = iVar4;
    ncnn::Mat::create(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,in_stack_fffffffffffffab8,
                      (int)((ulong)in_stack_fffffffffffffab0 >> 0x20),
                      (size_t)in_stack_fffffffffffffaa8,
                      (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),in_stack_fffffffffffffad0);
    bVar3 = ncnn::Mat::empty((Mat *)in_stack_fffffffffffffaa0);
    uVar12 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffc48);
    if (bVar3) {
      local_4 = -100;
    }
    else {
      ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffe68);
      pAVar6 = *(Allocator **)&(local_28->super_Layer).support_tensor_storage;
      ncnn::Mat::create(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,
                        in_stack_fffffffffffffab8,(int)((ulong)in_stack_fffffffffffffab0 >> 0x20),
                        (size_t)in_stack_fffffffffffffaa8,
                        (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),in_stack_fffffffffffffad0);
      bVar3 = ncnn::Mat::empty((Mat *)in_stack_fffffffffffffaa0);
      uVar11 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffc40);
      if (bVar3) {
        local_4 = -100;
      }
      else {
        if ((local_110.elempack == 8) && (local_138 == 4)) {
          if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
             ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            conv1x1s1_sgemm_pack8to4_int8_sse
                      (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                       (Mat *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                       in_stack_fffffffffffffb08);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            conv1x1s2_pack8to4_int8_sse
                      ((Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       in_stack_fffffffffffffbe8,
                       (Mat *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       in_stack_fffffffffffffbd8);
          }
          else {
            uVar9 = (undefined4)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
            uVar8 = (undefined4)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
            uVar7 = (undefined4)((ulong)pAVar6 >> 0x20);
            in_stack_fffffffffffffab0 = local_28;
            if (((local_28->super_Layer).support_reserved_11 & 1U) == 0) {
              lVar1 = *(long *)(*in_RDI + -0x18);
              in_stack_fffffffffffffaa8 =
                   (Mat *)CONCAT44(uVar9,*(undefined4 *)((long)in_RDI + lVar1 + 0xe8));
              in_stack_fffffffffffffaa0 =
                   (Convolution *)CONCAT44(uVar8,*(undefined4 *)((long)in_RDI + lVar1 + 0xe4));
              pAVar6 = (Allocator *)CONCAT44(uVar7,*(undefined4 *)((long)in_RDI + lVar1 + 0xe0));
              convolution_pack8to4_int8_sse
                        (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                         in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                         (int)top_blob_int32.cstep,in_stack_00000418,(int)out_elemsize,
                         (Option *)CONCAT44(in_stack_0000042c,in_stack_00000428));
            }
            else {
              lVar1 = *(long *)(*in_RDI + -0x18);
              in_stack_fffffffffffffaa8 =
                   (Mat *)CONCAT44(uVar9,*(undefined4 *)((long)in_RDI + lVar1 + 0xe8));
              in_stack_fffffffffffffaa0 =
                   (Convolution *)CONCAT44(uVar8,*(undefined4 *)((long)in_RDI + lVar1 + 0xe4));
              pAVar6 = (Allocator *)CONCAT44(uVar7,*(undefined4 *)((long)in_RDI + lVar1 + 0xe0));
              convolution_im2col_sgemm_pack8to4_int8_sse
                        ((Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         in_stack_fffffffffffffbe8,
                         (Mat *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                         (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                         (int)in_stack_fffffffffffffbd8,iVar17,(int)in_stack_fffffffffffffc00,
                         in_stack_fffffffffffffc08,in_stack_fffffffffffffc10,
                         in_stack_fffffffffffffc18);
            }
          }
          ncnn::Mat::Mat((Mat *)in_stack_fffffffffffffab0,
                         (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                         (size_t)in_stack_fffffffffffffaa0,pAVar6);
          for (local_1e4 = 0; local_1e4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
              ; local_1e4 = local_1e4 + 1) {
            in_stack_fffffffffffffc38 =
                 (Mat *)ncnn::Mat::operator[]
                                  ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                   (long)local_1e4);
            if ((*(float *)&in_stack_fffffffffffffc38->data != 0.0) ||
               (NAN(*(float *)&in_stack_fffffffffffffc38->data))) {
              in_stack_fffffffffffffc30 =
                   (Mat *)ncnn::Mat::operator[]
                                    ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x238),0);
              fVar16 = *(float *)&in_stack_fffffffffffffc30->data;
              in_stack_fffffffffffffc28 =
                   (Option *)
                   ncnn::Mat::operator[]
                             ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                              (long)local_1e4);
              local_1e8 = 1.0 / (fVar16 * *(float *)in_stack_fffffffffffffc28);
            }
            else {
              local_1e8 = 0.0;
            }
            in_stack_fffffffffffffc18 =
                 (Option *)ncnn::Mat::operator[]((Mat *)&stack0xfffffffffffffe20,(long)local_1e4);
            *(float *)in_stack_fffffffffffffc18 = local_1e8;
          }
          if (bVar2) {
            dequantize_from_int32
                      (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                       (Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       in_stack_fffffffffffffbe8,
                       (Option *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
            }
          }
          else {
            pAVar6 = (Allocator *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110);
            in_stack_fffffffffffffaa0 = local_28;
            requantize_from_int32_to_int8
                      ((Mat *)CONCAT44(uVar15,iVar14),(Mat *)CONCAT44(iVar13,uVar12),
                       (Mat *)CONCAT44(iVar4,uVar11),in_stack_fffffffffffffc38,
                       in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                       (Mat *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       in_stack_fffffffffffffc68);
          }
          ncnn::Mat::~Mat((Mat *)0x2c6017);
        }
        if ((local_110.elempack == 1) && (local_138 == 4)) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          in_stack_fffffffffffffaa8 =
               (Mat *)CONCAT44((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                               *(undefined4 *)((long)in_RDI + lVar1 + 0xe8));
          in_stack_fffffffffffffaa0 =
               (Convolution *)
               CONCAT44((int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),
                        *(undefined4 *)((long)in_RDI + lVar1 + 0xe4));
          pAVar6 = (Allocator *)
                   CONCAT44((int)((ulong)pAVar6 >> 0x20),
                            *(undefined4 *)((long)in_RDI + lVar1 + 0xe0));
          in_stack_fffffffffffffab0 = local_28;
          convolution_pack1to4_int8_sse
                    (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                     (Mat *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                     in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe48);
          ncnn::Mat::Mat((Mat *)in_stack_fffffffffffffab0,
                         (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                         (size_t)in_stack_fffffffffffffaa0,pAVar6);
          for (iVar17 = 0; iVar17 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
              iVar17 = iVar17 + 1) {
            pfVar5 = ncnn::Mat::operator[]
                               ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                (long)iVar17);
            if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
              in_stack_fffffffffffffc00 =
                   (Mat *)ncnn::Mat::operator[]
                                    ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x238),0);
              in_stack_fffffffffffffbf4 = *(float *)&in_stack_fffffffffffffc00->data;
              in_stack_fffffffffffffbf8 =
                   (Mat *)ncnn::Mat::operator[]
                                    ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                     (long)iVar17);
              local_238 = 1.0 / (in_stack_fffffffffffffbf4 *
                                *(float *)&in_stack_fffffffffffffbf8->data);
            }
            else {
              local_238 = 0.0;
            }
            in_stack_fffffffffffffbe4 = local_238;
            in_stack_fffffffffffffbe8 =
                 (Mat *)ncnn::Mat::operator[]((Mat *)&stack0xfffffffffffffdd0,(long)iVar17);
            *(float *)&in_stack_fffffffffffffbe8->data = in_stack_fffffffffffffbe4;
          }
          if (bVar2) {
            dequantize_from_int32
                      (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                       (Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       in_stack_fffffffffffffbe8,
                       (Option *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
            }
          }
          else {
            pAVar6 = (Allocator *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110);
            in_stack_fffffffffffffaa0 = local_28;
            requantize_from_int32_to_int8
                      ((Mat *)CONCAT44(uVar15,iVar14),(Mat *)CONCAT44(iVar13,uVar12),
                       (Mat *)CONCAT44(iVar4,uVar11),in_stack_fffffffffffffc38,
                       in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                       (Mat *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       in_stack_fffffffffffffc68);
          }
          ncnn::Mat::~Mat((Mat *)0x2c6369);
        }
        iVar17 = (int)in_stack_fffffffffffffc18;
        if ((local_110.elempack == 8) && (local_138 == 1)) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          in_stack_fffffffffffffaa8 =
               (Mat *)CONCAT44((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                               *(undefined4 *)((long)in_RDI + lVar1 + 0xe8));
          in_stack_fffffffffffffaa0 =
               (Convolution *)
               CONCAT44((int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),
                        *(undefined4 *)((long)in_RDI + lVar1 + 0xe4));
          pAVar6 = (Allocator *)
                   CONCAT44((int)((ulong)pAVar6 >> 0x20),
                            *(undefined4 *)((long)in_RDI + lVar1 + 0xe0));
          in_stack_fffffffffffffab0 = local_28;
          convolution_pack8to1_int8_sse
                    ((Mat *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (Mat *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     (Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,
                     in_stack_fffffffffffffe88);
          ncnn::Mat::Mat((Mat *)in_stack_fffffffffffffab0,
                         (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                         (size_t)in_stack_fffffffffffffaa0,pAVar6);
          for (local_284 = 0; iVar17 = (int)in_stack_fffffffffffffc18,
              local_284 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
              local_284 = local_284 + 1) {
            pfVar5 = ncnn::Mat::operator[]
                               ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                (long)local_284);
            if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
              pfVar5 = ncnn::Mat::operator[]
                                 ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x238),0);
              fVar16 = *pfVar5;
              pfVar5 = ncnn::Mat::operator[]
                                 ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                  (long)local_284);
              local_288 = 1.0 / (fVar16 * *pfVar5);
            }
            else {
              local_288 = 0.0;
            }
            fVar16 = local_288;
            pfVar5 = ncnn::Mat::operator[](&local_280,(long)local_284);
            *pfVar5 = fVar16;
          }
          if (bVar2) {
            dequantize_from_int32
                      (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                       (Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                       in_stack_fffffffffffffbe8,
                       (Option *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
            }
          }
          else {
            pAVar6 = (Allocator *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110);
            in_stack_fffffffffffffaa0 = local_28;
            requantize_from_int32_to_int8
                      ((Mat *)CONCAT44(uVar15,iVar14),(Mat *)CONCAT44(iVar13,uVar12),
                       (Mat *)CONCAT44(iVar4,uVar11),in_stack_fffffffffffffc38,
                       in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                       (Mat *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       in_stack_fffffffffffffc68);
          }
          ncnn::Mat::~Mat((Mat *)0x2c66bb);
        }
        if ((local_110.elempack == 1) && (local_138 == 1)) {
          if ((((((local_28->super_Layer).support_reserved_10 & 1U) == 0) ||
               (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 3 ||
                 (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 3)) ||
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1)))) ||
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1 ||
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1)) ||
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1)))) ||
             ((local_110.c * local_110.elempack < 0x10 ||
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0x10)))) {
            if (((((local_28->super_Layer).support_reserved_11 & 1U) == 0) ||
                ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                 (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1)))) ||
               ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 1)))) {
              _w = (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
              _elemsize = CONCAT44((int)((ulong)in_stack_fffffffffffffaa0 >> 0x20),
                                   *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4)
                                  );
              pAVar6 = (Allocator *)
                       CONCAT44((int)((ulong)pAVar6 >> 0x20),
                                *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0));
              pCVar10 = local_28;
              convolution_int8(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                               (Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                               (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
                               (int)in_stack_fffffffffffffbe8,(int)in_stack_fffffffffffffbe4,
                               in_stack_fffffffffffffc10,iVar17,in_stack_fffffffffffffc20,
                               in_stack_fffffffffffffc28);
              ncnn::Mat::Mat((Mat *)pCVar10,_w,_elemsize,pAVar6);
              for (iVar17 = 0; iVar17 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
                  iVar17 = iVar17 + 1) {
                pfVar5 = ncnn::Mat::operator[]
                                   ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                    (long)iVar17);
                if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
                  pfVar5 = ncnn::Mat::operator[]
                                     ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x238),0);
                  fVar16 = *pfVar5;
                  pfVar5 = ncnn::Mat::operator[]
                                     ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                      (long)iVar17);
                  fVar16 = 1.0 / (fVar16 * *pfVar5);
                }
                else {
                  fVar16 = 0.0;
                }
                in_stack_fffffffffffffc60 = fVar16;
                pfVar5 = ncnn::Mat::operator[]((Mat *)&stack0xfffffffffffffc68,(long)iVar17);
                *pfVar5 = fVar16;
              }
              if (bVar2) {
                dequantize_from_int32
                          (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                           (Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                           in_stack_fffffffffffffbe8,
                           (Option *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
                if (in_RDI[1] != 0) {
                  (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
                }
              }
              else {
                requantize_from_int32_to_int8
                          ((Mat *)CONCAT44(uVar15,iVar14),(Mat *)CONCAT44(iVar13,uVar12),
                           (Mat *)CONCAT44(iVar4,uVar11),in_stack_fffffffffffffc38,
                           in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20)
                           ,(Mat *)CONCAT44(iVar17,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc68);
              }
              ncnn::Mat::~Mat((Mat *)0x2c7423);
            }
            else {
              if (bVar2) {
                std::vector<float,_std::allocator<float>_>::vector
                          ((vector<float,_std::allocator<float>_> *)0x2c6e5e);
                for (iVar17 = 0; iVar17 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
                    ; iVar17 = iVar17 + 1) {
                  pfVar5 = ncnn::Mat::operator[]
                                     ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                      (long)iVar17);
                  if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
                    ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x238),0);
                    ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                               (long)iVar17);
                  }
                  std::vector<float,_std::allocator<float>_>::push_back
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffab0,
                             (value_type_conflict4 *)in_stack_fffffffffffffaa8);
                }
                std::vector<float,_std::allocator<float>_>::vector
                          ((vector<float,_std::allocator<float>_> *)
                           ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x160),local_20);
                pCVar10 = local_28;
                conv_im2col_sgemm_int8_dequant_sse
                          ((Mat *)CONCAT44(top_blob_int32.cstep._4_4_,(int)top_blob_int32.cstep),
                           (Mat *)top_blob_int32._56_8_,(Mat *)top_blob_int32._48_8_,
                           top_blob_int32.w,top_blob_int32.dims,top_blob_int32.allocator._4_4_,
                           (int)out_elemsize,(Mat *)CONCAT44(in_stack_0000042c,in_stack_00000428),
                           (vector<float,_std::allocator<float>_> *)CONCAT44(outh,out_elempack),
                           (Option *)_outw);
                std::vector<float,_std::allocator<float>_>::~vector
                          ((vector<float,_std::allocator<float>_> *)pCVar10);
                std::vector<float,_std::allocator<float>_>::~vector
                          ((vector<float,_std::allocator<float>_> *)pCVar10);
              }
              else {
                std::vector<float,_std::allocator<float>_>::vector
                          ((vector<float,_std::allocator<float>_> *)0x2c6b50);
                for (local_2f4 = 0;
                    local_2f4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
                    local_2f4 = local_2f4 + 1) {
                  pfVar5 = ncnn::Mat::operator[]
                                     ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                      (long)local_2f4);
                  if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
                    ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x238),0);
                    ncnn::Mat::operator[]
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                               (long)local_2f4);
                  }
                  ncnn::Mat::operator[]
                            ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x280),0);
                  std::vector<float,_std::allocator<float>_>::push_back
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffab0,
                             (value_type_conflict4 *)in_stack_fffffffffffffaa8);
                  std::vector<float,_std::allocator<float>_>::push_back
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffab0,
                             (value_type_conflict4 *)in_stack_fffffffffffffaa8);
                }
                std::vector<float,_std::allocator<float>_>::vector
                          (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
                pCVar10 = local_28;
                conv_im2col_sgemm_int8_requant_sse
                          (_channels,_kernel_extent_w,_outw,outh,out_elempack,in_stack_0000042c,
                           opt_q._32_4_,(Mat *)opt_q._40_8_,
                           (vector<float,_std::allocator<float>_> *)opt_q._48_8_,
                           (Option *)opt_q._56_8_);
                std::vector<float,_std::allocator<float>_>::~vector
                          ((vector<float,_std::allocator<float>_> *)pCVar10);
                std::vector<float,_std::allocator<float>_>::~vector
                          ((vector<float,_std::allocator<float>_> *)pCVar10);
              }
              if (in_RDI[1] != 0) {
                (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
              }
            }
          }
          else {
            conv3x3s1_winograd23_int8_sse
                      (in_stack_00000940,in_stack_00000938,in_stack_00000930,in_stack_00000928);
            ncnn::Mat::Mat((Mat *)in_stack_fffffffffffffab0,
                           (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                           (size_t)in_stack_fffffffffffffaa0,pAVar6);
            for (local_2d4 = 0;
                local_2d4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
                local_2d4 = local_2d4 + 1) {
              pfVar5 = ncnn::Mat::operator[]
                                 ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                  (long)local_2d4);
              if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) {
                pfVar5 = ncnn::Mat::operator[]
                                   ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x238),0);
                fVar16 = *pfVar5;
                pfVar5 = ncnn::Mat::operator[]
                                   ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f0),
                                    (long)local_2d4);
                local_2d8 = 1.0 / (fVar16 * *pfVar5);
              }
              else {
                local_2d8 = 0.0;
              }
              pfVar5 = ncnn::Mat::operator[](&local_2d0,(long)local_2d4);
              *pfVar5 = local_2d8;
            }
            if (bVar2) {
              dequantize_from_int32
                        (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                         (Mat *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         in_stack_fffffffffffffbe8,
                         (Option *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
              if (in_RDI[1] != 0) {
                (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
              }
            }
            else {
              requantize_from_int32_to_int8
                        ((Mat *)CONCAT44(uVar15,iVar14),(Mat *)CONCAT44(iVar13,uVar12),
                         (Mat *)CONCAT44(iVar4,uVar11),in_stack_fffffffffffffc38,
                         in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                         (Mat *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                         in_stack_fffffffffffffc68);
            }
            ncnn::Mat::~Mat((Mat *)0x2c6aae);
          }
        }
        local_4 = 0;
      }
      ncnn::Mat::~Mat((Mat *)0x2c744a);
    }
  }
  ncnn::Mat::~Mat((Mat *)0x2c7468);
  ncnn::Mat::~Mat((Mat *)0x2c7475);
  return local_4;
}

Assistant:

int Convolution_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);
            //             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
        else if (opt.use_sgemm_convolution && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
        {
            if (use_int8_requantize)
            {
                std::vector<float> requantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    float scale_out = top_blob_int8_scales[0];

                    requantize_scales.push_back(scale_in);
                    requantize_scales.push_back(scale_out);
                }

                conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
            }
            else
            {
                std::vector<float> dequantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    dequantize_scales.push_back(scale_in);
                }

                conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
        else
        {
            //         convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
    }

    return 0;
}